

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::Pipeline::ByteSizeLong(Pipeline *this)

{
  uint uVar1;
  Type *value;
  size_t sVar2;
  Type *value_00;
  size_t sVar3;
  uint i;
  uint uVar4;
  uint index;
  ulong uVar5;
  
  uVar1 = (this->models_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar1;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                      (&(this->models_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Model>(value);
    uVar5 = uVar5 + sVar2;
  }
  uVar1 = (this->names_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = uVar5 + uVar1;
  index = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  for (; uVar4 != index; index = index + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->names_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
    sVar2 = sVar2 + sVar3;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t Pipeline::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Pipeline)
  size_t total_size = 0;

  // repeated .CoreML.Specification.Model models = 1;
  {
    unsigned int count = this->models_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->models(i));
    }
  }

  // repeated string names = 2;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->names_size());
  for (int i = 0, n = this->names_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->names(i));
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}